

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

toml_type_t __thiscall
loltoml::v_0_1_1::detail::parser_t<comments_skipper_t>::parse_value
          (parser_t<comments_skipper_t> *this)

{
  char cVar1;
  toml_type_t tVar2;
  
  cVar1 = input_stream_t::peek(&this->input);
  if (cVar1 == '\"') {
    parse_string(this);
  }
  else {
    if (cVar1 != '\'') {
      if (cVar1 == '[') {
        parse_array(this);
        return array;
      }
      if (cVar1 == 'f') {
        parse_false(this);
      }
      else {
        if (cVar1 != 't') {
          if (cVar1 == '{') {
            parse_inline_table(this);
            return table;
          }
          tVar2 = parse_date_or_number(this);
          return tVar2;
        }
        parse_true(this);
      }
      return boolean;
    }
    parse_literal_string(this);
  }
  return string;
}

Assistant:

toml_type_t parse_value() {
        switch (input.peek()) {
            case '{': {
                parse_inline_table();
                return toml_type_t::table;
            } break;
            case '[': {
                parse_array();
                return toml_type_t::array;
            } break;
            case '"': {
                parse_string();
                return toml_type_t::string;
            } break;
            case '\'': {
                parse_literal_string();
                return toml_type_t::string;
            } break;
            case 't': {
                parse_true();
                return toml_type_t::boolean;
            } break;
            case 'f': {
                parse_false();
                return toml_type_t::boolean;
            } break;
            default: {
                return parse_date_or_number();
            }
        }
    }